

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_translate_keyword
              (char *inrec,char *outrec,char *(*patterns) [2],int npat,int n_value,int n_offset,
              int n_range,int *pat_num,int *i,int *j,int *m,int *n,int *status)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ushort **ppuVar5;
  int in_ECX;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar6;
  bool bVar7;
  int val;
  char *spat;
  int firstfail;
  int pass;
  int pat;
  int ic;
  int ip;
  char s;
  char c;
  char oldp;
  char a;
  int fac;
  int m1;
  int n1;
  int j1;
  int i1;
  int local_64;
  int local_50;
  int local_4c;
  int local_48;
  char local_43;
  char local_42;
  char local_41;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_4;
  
  local_30 = 0;
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_41 = ' ';
  bVar7 = false;
  if (*(int *)CONCAT44(n_offset,i1) < 1) {
    if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
      *(undefined4 *)CONCAT44(n_offset,i1) = 0x73;
      local_4 = 0x73;
    }
    else {
      *in_RSI = '\0';
      if (*in_RDI == '\0') {
        strcpy(in_RDI,"        ");
      }
      local_42 = '\0';
      bVar3 = false;
      for (local_50 = 0; local_50 < in_ECX; local_50 = local_50 + 1) {
        pcVar2 = *(char **)(in_RDX + (long)local_50 * 0x10);
        local_30 = 0;
        local_34 = 0;
        local_3c = -1;
        local_38 = -1;
        local_41 = ' ';
        bVar7 = false;
        if (*pcVar2 == '*') {
          bVar7 = true;
          break;
        }
        if ((!bVar3) || (*pcVar2 != local_42)) {
          local_42 = *pcVar2;
          local_48 = 0;
          bVar3 = true;
          for (local_4c = 0; pcVar2[local_48] != '\0' && local_4c < 8; local_4c = local_4c + 1) {
            local_43 = in_RDI[local_4c];
            cVar1 = pcVar2[local_48];
            if (cVar1 == 'i') {
              ppuVar5 = __ctype_b_loc();
              if (((*ppuVar5)[(int)local_43] & 0x800) != 0) {
                local_30 = local_43 + -0x30;
                bVar7 = true;
              }
            }
            else if (cVar1 == 'j') {
              ppuVar5 = __ctype_b_loc();
              if (((*ppuVar5)[(int)local_43] & 0x800) != 0) {
                local_34 = local_43 + -0x30;
                bVar7 = true;
              }
            }
            else if (((cVar1 == 'n') || (cVar1 == 'm')) || (cVar1 == '#')) {
              local_64 = 0;
              bVar7 = false;
              ppuVar5 = __ctype_b_loc();
              if (((*ppuVar5)[(int)local_43] & 0x800) != 0) {
                bVar7 = true;
                while( true ) {
                  bVar6 = false;
                  if (local_4c < 8) {
                    ppuVar5 = __ctype_b_loc();
                    bVar6 = ((*ppuVar5)[(int)local_43] & 0x800) != 0;
                  }
                  if (!bVar6) break;
                  local_64 = local_64 * 10 + local_43 + -0x30;
                  local_4c = local_4c + 1;
                  local_43 = in_RDI[local_4c];
                }
                local_4c = local_4c + -1;
                if (cVar1 == 'n') {
                  if (((local_64 < 1) || (999 < local_64)) ||
                     (((((int)spat != 0 || (local_64 != in_R8D)) &&
                       (((int)spat != -1 || (in_R8D < local_64)))) &&
                      (((int)spat != 1 || (local_64 < in_R8D)))))) {
                    bVar7 = false;
                  }
                  else {
                    local_38 = local_64;
                  }
                }
                else if (cVar1 == 'm') {
                  local_3c = local_64;
                }
              }
            }
            else if (cVar1 == 'a') {
              ppuVar5 = __ctype_b_loc();
              if ((((*ppuVar5)[(int)local_43] & 0x100) != 0) || (local_43 == ' ')) {
                bVar7 = true;
                local_41 = local_43;
              }
            }
            else if (cVar1 == '?') {
              bVar7 = true;
            }
            else {
              bVar7 = local_43 == cVar1;
            }
            if (!bVar7) break;
            local_48 = local_48 + 1;
            bVar3 = false;
          }
          if ((bVar7) && ((7 < local_4c || (in_RDI[local_4c] == ' ')))) break;
        }
      }
      if (_pat != (int *)0x0) {
        *_pat = local_30;
      }
      if (_ip != (int *)0x0) {
        *_ip = local_34;
      }
      if (_n1 != (int *)0x0) {
        *_n1 = local_38;
      }
      if (_fac != (int *)0x0) {
        *_fac = local_3c;
      }
      if (_firstfail != (int *)0x0) {
        *_firstfail = local_50;
      }
      pcVar2 = *(char **)(in_RDX + (long)local_50 * 0x10 + 8);
      if ((bVar7) && (iVar4 = strcmp(pcVar2,"--"), iVar4 == 0)) {
        strcpy(in_RSI,"-");
        strncat(in_RSI,in_RDI,8);
        in_RSI[9] = '\0';
        local_30 = 8;
        while( true ) {
          bVar7 = false;
          if (1 < local_30) {
            bVar7 = in_RSI[local_30] == ' ';
          }
          if (!bVar7) break;
          in_RSI[local_30] = '\0';
          local_30 = local_30 + -1;
        }
        local_4 = 0;
      }
      else if ((bVar7) && ((*pcVar2 != '\0' && (iVar4 = strcmp(pcVar2,"-"), iVar4 != 0)))) {
        strcpy(in_RSI,in_RDI);
        if (*pcVar2 == '+') {
          local_4 = 0;
        }
        else {
          local_4c = 0;
          for (local_48 = 0; pcVar2[local_48] != '\0'; local_48 = local_48 + 1) {
            cVar1 = pcVar2[local_48];
            if (cVar1 == 'i') {
              in_RSI[local_4c] = (char)local_30 + '0';
            }
            else if (cVar1 == 'j') {
              in_RSI[local_4c] = (char)local_34 + '0';
            }
            else if (cVar1 == 'n') {
              if (local_38 == -1) {
                local_38 = in_R8D;
              }
              if (0 < local_38) {
                local_38 = in_R9D + local_38;
                for (local_40 = 1; 0 < local_38 / local_40; local_40 = local_40 * 10) {
                }
                while (local_40 = local_40 / 10, 0 < local_40) {
                  in_RSI[local_4c] =
                       (char)((long)((ulong)(uint)((int)((long)local_38 / (long)local_40) >> 0x1f)
                                     << 0x20 | (long)local_38 / (long)local_40 & 0xffffffffU) % 10)
                       + '0';
                  local_4c = local_4c + 1;
                }
                local_4c = local_4c + -1;
              }
            }
            else if ((cVar1 == 'm') && (-1 < local_3c)) {
              for (local_40 = 1; 0 < local_3c / local_40; local_40 = local_40 * 10) {
              }
              while (local_40 = local_40 / 10, 0 < local_40) {
                in_RSI[local_4c] =
                     (char)((long)((ulong)(uint)((int)((long)local_3c / (long)local_40) >> 0x1f) <<
                                   0x20 | (long)local_3c / (long)local_40 & 0xffffffffU) % 10) + '0'
                ;
                local_4c = local_4c + 1;
              }
              local_4c = local_4c + -1;
            }
            else if (cVar1 == 'a') {
              in_RSI[local_4c] = local_41;
            }
            else {
              in_RSI[local_4c] = cVar1;
            }
            local_4c = local_4c + 1;
          }
          for (; local_4c < 8; local_4c = local_4c + 1) {
            in_RSI[local_4c] = ' ';
          }
          local_4 = *(int *)CONCAT44(n_offset,i1);
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = *(int *)CONCAT44(n_offset,i1);
  }
  return local_4;
}

Assistant:

int fits_translate_keyword(
      char *inrec,        /* I - input string */
      char *outrec,       /* O - output converted string, or */
                          /*     a null string if input does not  */
                          /*     match any of the patterns */
      char *patterns[][2],/* I - pointer to input / output string */
                          /*     templates */
      int npat,           /* I - number of templates passed */
      int n_value,        /* I - base 'n' template value of interest */
      int n_offset,       /* I - offset to be applied to the 'n' */
                          /*     value in the output string */
      int n_range,        /* I - controls range of 'n' template */
                          /*     values of interest (-1,0, or +1) */
      int *pat_num,       /* O - matched pattern number (0 based) or -1 */
      int *i,             /* O - value of i, if any, else 0 */
      int *j,             /* O - value of j, if any, else 0 */
      int *m,             /* O - value of m, if any, else 0 */
      int *n,             /* O - value of n, if any, else 0 */

      int *status)        /* IO - error status */

/* 

Translate a keyword name to a new name, based on a set of patterns.
The user passes an array of patterns to be matched.  Input pattern
number i is pattern[i][0], and output pattern number i is
pattern[i][1].  Keywords are matched against the input patterns.  If a
match is found then the keyword is re-written according to the output
pattern.

Order is important.  The first match is accepted.  The fastest match
will be made when templates with the same first character are grouped
together.

Several characters have special meanings:

     i,j - single digits, preserved in output template
     n - column number of one or more digits, preserved in output template
     m - generic number of one or more digits, preserved in output template
     a - coordinate designator, preserved in output template
     # - number of one or more digits
     ? - any character
     * - only allowed in first character position, to match all
         keywords; only useful as last pattern in the list

i, j, n, and m are returned by the routine.

For example, the input pattern "iCTYPn" will match "1CTYP5" (if n_value
is 5); the output pattern "CTYPEi" will be re-written as "CTYPE1".
Notice that "i" is preserved.

The following output patterns are special

Special output pattern characters:

    "-" - do not copy a keyword that matches the corresponding input pattern

    "+" - copy the input unchanged

The inrec string could be just the 8-char keyword name, or the entire 
80-char header record.  Characters 9 = 80 in the input string simply get
appended to the translated keyword name.

If n_range = 0, then only keywords with 'n' equal to n_value will be 
considered as a pattern match.  If n_range = +1, then all values of 
'n' greater than or equal to n_value will be a match, and if -1, 
then values of 'n' less than or equal to n_value will match.

  This routine was written by Craig Markwardt, GSFC
*/

{
    int i1 = 0, j1 = 0, n1 = 0, m1 = 0;
    int fac;
    char a = ' ';
    char oldp;
    char c, s;
    int ip, ic, pat, pass = 0, firstfail;
    char *spat;

    if (*status > 0)
        return(*status);
    if ((inrec == 0) || (outrec == 0)) 
      return (*status = NULL_INPUT_PTR);

    *outrec = '\0';
/*
    if (*inrec == '\0') return 0;
*/

    if (*inrec == '\0')    /* expand to full 8 char blank keyword name */
       strcpy(inrec, "        ");
       
    oldp = '\0';
    firstfail = 0;

    /* ===== Pattern match stage */
    for (pat=0; pat < npat; pat++) {
      spat = patterns[pat][0];
      
      i1 = 0; j1 = 0; m1 = -1; n1 = -1; a = ' ';  /* Initialize the place-holders */
      pass = 0;
      
      /* Pass the wildcard pattern */
      if (spat[0] == '*') { 
	pass = 1;
	break;
      }
      
      /* Optimization: if we have seen this initial pattern character before,
	 then it must have failed, and we can skip the pattern */
      if (firstfail && spat[0] == oldp) continue;
      oldp = spat[0];

      /* 
	 ip = index of pattern character being matched
	 ic = index of keyname character being matched
	 firstfail = 1 if we fail on the first characteor (0=not)
      */
      
      for (ip=0, ic=0, firstfail=1;
	   (spat[ip]) && (ic < 8);
	   ip++, ic++, firstfail=0) {
	c = inrec[ic];
	s = spat[ip];

	if (s == 'i') {
	  /* Special pattern: 'i' placeholder */
	  if (isdigit(c)) { i1 = c - '0'; pass = 1;}
	} else if (s == 'j') {
	  /* Special pattern: 'j' placeholder */
	  if (isdigit(c)) { j1 = c - '0'; pass = 1;}
	} else if ((s == 'n')||(s == 'm')||(s == '#')) {
	  /* Special patterns: multi-digit number */
	  int val = 0;
	  pass = 0;
	  if (isdigit(c)) {
	    pass = 1;  /* NOTE, could fail below */
	    
	    /* Parse decimal number */
	    while (ic<8 && isdigit(c)) { 
	      val = val*10 + (c - '0');
	      ic++; c = inrec[ic];
	    }
	    ic--; c = inrec[ic];
	    
	    if (s == 'n') { 
	      
	      /* Is it a column number? */
	      if ( val >= 1 && val <= 999 &&                    /* Row range check */
		   (((n_range == 0) && (val == n_value)) ||     /* Strict equality */
		    ((n_range == -1) && (val <= n_value)) ||    /* n <= n_value */
		    ((n_range == +1) && (val >= n_value))) ) {  /* n >= n_value */
		n1 = val;
	      } else {
		pass = 0;
	      }
	    } else if (s == 'm') {
	      
	      /* Generic number */
	      m1 = val; 
	    }
	  }
	} else if (s == 'a') {
	  /* Special pattern: coordinate designator */
	  if (isupper(c) || c == ' ') { a = c; pass = 1;} 
	} else if (s == '?') {
	  /* Match any individual character */
	  pass = 1;
	} else if (c == s) {
	  /* Match a specific character */
	  pass = 1;
	} else {
	  /* FAIL */
	  pass = 0;
	}
	if (!pass) break;
      }
      
      /* Must pass to the end of the keyword.  No partial matches allowed */
      if (pass && (ic >= 8 || inrec[ic] == ' ')) break;
    }

    /* Transfer the pattern-matched numbers to the output parameters */
    if (i) { *i = i1; }
    if (j) { *j = j1; }
    if (n) { *n = n1; }
    if (m) { *m = m1; }
    if (pat_num) { *pat_num = pat; }

    /* ===== Keyword rewriting and output stage */
    spat = patterns[pat][1];

    /* Return case: explicit deletion, return '-' */
    if (pass && strcmp(spat,"--") == 0) {
      strcpy(outrec, "-");
      strncat(outrec, inrec, 8);
      outrec[9] = 0;
      for(i1=8; i1>1 && outrec[i1] == ' '; i1--) outrec[i1] = 0;
      return 0;
    }

    /* Return case: no match, or do-not-transfer pattern */
    if (pass == 0 || spat[0] == '\0' || strcmp(spat,"-") == 0) return 0;
    /* A match: we start by copying the input record to the output */
    strcpy(outrec, inrec);

    /* Return case: return the input record unchanged */
    if (spat[0] == '+') return 0;


    /* Final case: a new output pattern */
    for (ip=0, ic=0; spat[ip]; ip++, ic++) {
      s = spat[ip];
      if (s == 'i') {
	outrec[ic] = (i1+'0');
      } else if (s == 'j') {
	outrec[ic] = (j1+'0');
      } else if (s == 'n') {
	if (n1 == -1) { n1 = n_value; }
	if (n1 > 0) {
	  n1 += n_offset;
	  for (fac = 1; (n1/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((n1/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
	}
      } else if (s == 'm' && m1 >= 0) {
	for (fac = 1; (m1/fac) > 0; fac *= 10);
	fac /= 10;
	while(fac > 0) {
	  outrec[ic] = ((m1/fac) % 10) + '0';
	  fac /= 10;
	  ic ++;
	}
	ic --;
      } else if (s == 'a') {
	outrec[ic] = a;
      } else {
	outrec[ic] = s;
      }
    }

    /* Pad the keyword name with spaces */
    for ( ; ic<8; ic++) { outrec[ic] = ' '; }

    return(*status);
}